

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Vec3fa __thiscall
embree::XMLLoader::load<embree::Vec3fa>(XMLLoader *this,Ref<embree::XML> *xml,Vec3fa *opt)

{
  long lVar1;
  runtime_error *this_00;
  long *plVar2;
  float *in_RCX;
  long *plVar3;
  float fVar4;
  float fVar5;
  ulong in_XMM1_Qa;
  Vec3fa VVar6;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  float local_68;
  float local_58;
  string local_40;
  
  lVar1 = *(long *)&opt->field_0;
  if (lVar1 == 0) {
    local_58 = *in_RCX;
    local_68 = in_RCX[1];
    fVar4 = in_RCX[2];
    fVar5 = in_RCX[3];
  }
  else {
    if (*(long *)(lVar1 + 0xa0) - (long)*(Token **)(lVar1 + 0x98) != 0xd8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ParseLocation::str_abi_cxx11_(&local_40,(ParseLocation *)(*(long *)&opt->field_0 + 0x10));
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
      local_88 = (long *)*plVar2;
      plVar3 = plVar2 + 2;
      if (local_88 == plVar3) {
        local_78 = *plVar3;
        lStack_70 = plVar2[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar3;
      }
      local_80 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_88);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_58 = Token::Float(*(Token **)(lVar1 + 0x98),true);
    local_68 = Token::Float((Token *)(*(long *)(*(long *)&opt->field_0 + 0x98) + 0x48),true);
    fVar4 = Token::Float((Token *)(*(long *)(*(long *)&opt->field_0 + 0x98) + 0x90),true);
    fVar5 = 0.0;
    in_XMM1_Qa = (ulong)(uint)fVar4;
  }
  *(float *)&(this->path).filename._M_dataplus._M_p = local_58;
  *(float *)((long)&(this->path).filename._M_dataplus._M_p + 4) = local_68;
  *(float *)&(this->path).filename._M_string_length = fVar4;
  *(float *)((long)&(this->path).filename._M_string_length + 4) = fVar5;
  VVar6.field_0.m128[1] = local_68;
  VVar6.field_0.m128[0] = local_58;
  VVar6.field_0._8_8_ = in_XMM1_Qa;
  return (Vec3fa)VVar6.field_0;
}

Assistant:

Vec3fa XMLLoader::load<Vec3fa>(const Ref<XML>& xml, const Vec3fa& opt) {
    if (xml == null) return opt;
    if (xml->body.size() != 3) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float3 body");
    return Vec3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float());
  }